

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lineno.cpp
# Opt level: O2

bool __thiscall Lineno::getNextLine(Lineno *this)

{
  uint uVar1;
  istream *piVar2;
  
  this->lineno_ = this->lineno_ + 1;
  piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (this->file_,(string *)&this->line_);
  uVar1 = *(uint *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18) + 0x20);
  if ((uVar1 & 5) == 0) {
    std::__cxx11::string::push_back((char)&this->line_);
    this->pos_ = 0;
    this->start_ = 0;
    this->next_ = 1;
  }
  return (uVar1 & 5) == 0;
}

Assistant:

bool Lineno::getNextLine(void) {
    // add lineno
    ++lineno_;

    // read line
    if ( ! getline(file_, line_) ) {
        // touch the EOF.
        return false;
    }
    line_ += '\n';

    // init those var: pos, the scanner pointer,
    //                 start, the first token's pos
    pos_   = 0;
    start_ = 0;
    next_  = 1;

    return true;
}